

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

size_t encoder_nop_read(char *buffer,size_t size,_Bool ateof,curl_mimepart *part)

{
  size_t sVar1;
  ulong __n;
  
  sVar1 = (part->encstate).bufbeg;
  __n = (part->encstate).bufend - sVar1;
  if (size <= __n) {
    __n = size;
  }
  if (__n != 0) {
    memcpy(buffer,(part->encstate).buf,__n);
    sVar1 = (part->encstate).bufbeg;
  }
  (part->encstate).bufbeg = sVar1 + __n;
  return __n;
}

Assistant:

static size_t encoder_nop_read(char *buffer, size_t size, bool ateof,
                               curl_mimepart *part)
{
  mime_encoder_state *st = &part->encstate;
  size_t insize = st->bufend - st->bufbeg;

  (void) ateof;

  if(size > insize)
    size = insize;
  if(size)
    memcpy(buffer, st->buf, size);
  st->bufbeg += size;
  return size;
}